

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O0

void __thiscall
draco::Encoder::SetAttributeQuantization(Encoder *this,Type type,int quantization_bits)

{
  EncoderOptionsBase<draco::GeometryAttribute::Type> *pEVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_> *in_RDI;
  string *name;
  AttributeKey *in_stack_ffffffffffffffb8;
  DracoOptions<draco::GeometryAttribute::Type> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [16];
  undefined8 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  pEVar1 = EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>::options(in_RDI);
  name = (string *)&local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffe8,
             (allocator<char> *)in_stack_ffffffffffffffe0);
  DracoOptions<draco::GeometryAttribute::Type>::SetAttributeInt
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,name,(int)((ulong)pEVar1 >> 0x20));
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void Encoder::SetAttributeQuantization(GeometryAttribute::Type type,
                                       int quantization_bits) {
  options().SetAttributeInt(type, "quantization_bits", quantization_bits);
}